

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

bool __thiscall
cmsys::Glob::RecurseDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  Directory DVar1;
  bool bVar2;
  bool bVar3;
  unsigned_long uVar4;
  char *pcVar5;
  ulong uVar6;
  iterator __first;
  iterator __last;
  reference __lhs;
  pointer this_00;
  bool local_352;
  undefined1 local_2d8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_238;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  const_iterator pathIt;
  string message;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  Message local_160;
  undefined1 local_138 [8];
  string canonicalPath;
  string realPathErrorMessage;
  undefined1 local_f0 [6];
  bool isSymLink;
  bool isDir;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string fname;
  string realname;
  unsigned_long cc;
  Directory local_38;
  Directory d;
  GlobMessages *messages_local;
  string *dir_local;
  size_type start_local;
  Glob *this_local;
  
  d.Internal = (DirectoryInternals *)messages;
  Directory::Directory(&local_38);
  bVar2 = Directory::Load(&local_38,dir);
  if (bVar2) {
    std::__cxx11::string::string((string *)(fname.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_90);
    for (realname.field_2._8_8_ = 0; uVar4 = Directory::GetNumberOfFiles(&local_38),
        (ulong)realname.field_2._8_8_ < uVar4; realname.field_2._8_8_ = realname.field_2._8_8_ + 1)
    {
      pcVar5 = Directory::GetFile(&local_38,realname.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_90,pcVar5);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,".");
      if ((!bVar2) &&
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90,".."), !bVar2)) {
        if (start == 0) {
          std::operator+(&local_b0,dir,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_90);
          std::__cxx11::string::operator=
                    ((string *)(fname.field_2._M_local_buf + 8),(string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_b0);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,dir,"/");
          std::operator+(&local_d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_90);
          std::__cxx11::string::operator=
                    ((string *)(fname.field_2._M_local_buf + 8),(string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)local_f0);
        }
        bVar2 = SystemTools::FileIsDirectory((string *)((long)&fname.field_2 + 8));
        bVar3 = SystemTools::FileIsSymlink((string *)((long)&fname.field_2 + 8));
        if ((!bVar2) || ((bVar3 && ((this->RecurseThroughSymlinks & 1U) == 0)))) {
          bVar2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                  empty(&this->Internals->Expressions);
          local_352 = false;
          if (!bVar2) {
            std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::rbegin
                      ((vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *)local_2d8);
            this_00 = std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>_>
                                    *)local_2d8);
            local_352 = RegularExpression::find(this_00,(string *)local_90);
          }
          if (local_352 != false) {
            AddFile(this,&this->Internals->Files,(string *)((long)&fname.field_2 + 8));
          }
        }
        else if (bVar3) {
          this->FollowedSymlinkCount = this->FollowedSymlinkCount + 1;
          std::__cxx11::string::string((string *)(canonicalPath.field_2._M_local_buf + 8));
          SystemTools::GetRealPath
                    ((string *)local_138,dir,(string *)(canonicalPath.field_2._M_local_buf + 8));
          uVar6 = std::__cxx11::string::empty();
          DVar1 = d;
          if ((uVar6 & 1) == 0) {
            if (d.Internal != (DirectoryInternals *)0x0) {
              std::operator+(&local_1e0,"Canonical path generation from path \'",dir);
              std::operator+(&local_1c0,&local_1e0,"\' failed! Reason: \'");
              std::operator+(&local_1a0,&local_1c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&canonicalPath.field_2 + 8));
              std::operator+(&local_180,&local_1a0,"\'");
              Message::Message(&local_160,error,&local_180);
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::push_back
                        ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                         DVar1.Internal,&local_160);
              Message::~Message(&local_160);
              std::__cxx11::string::~string((string *)&local_180);
              std::__cxx11::string::~string((string *)&local_1a0);
              std::__cxx11::string::~string((string *)&local_1c0);
              std::__cxx11::string::~string((string *)&local_1e0);
            }
            this_local._7_1_ = 0;
            bVar2 = true;
          }
          else {
            __first = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::begin(&this->VisitedSymlinks);
            __last = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&this->VisitedSymlinks);
            local_1e8 = std::
                        find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                  (__first._M_current,__last._M_current,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_138);
            message.field_2._8_8_ =
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(&this->VisitedSymlinks);
            bVar2 = __gnu_cxx::operator==
                              (&local_1e8,
                               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&message.field_2 + 8));
            if (bVar2) {
              if ((this->RecurseListDirs & 1U) != 0) {
                AddFile(this,&this->Internals->Files,(string *)((long)&fname.field_2 + 8));
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&this->VisitedSymlinks,(value_type *)local_138);
              bVar2 = RecurseDirectory(this,start + 1,(string *)((long)&fname.field_2 + 8),
                                       (GlobMessages *)d.Internal);
              if (!bVar2) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::pop_back(&this->VisitedSymlinks);
                this_local._7_1_ = 0;
                bVar2 = true;
                goto LAB_0080b4b2;
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::pop_back(&this->VisitedSymlinks);
            }
            else if (d.Internal != (DirectoryInternals *)0x0) {
              std::__cxx11::string::string((string *)&pathIt);
              local_238._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->VisitedSymlinks);
              local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end(&this->VisitedSymlinks);
              local_230 = std::
                          find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                                    (local_238,
                                     (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                      )local_240,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_138);
              __gnu_cxx::
              __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ::__normal_iterator<std::__cxx11::string*>
                        ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          *)&local_228,&local_230);
              while( true ) {
                local_248._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(&this->VisitedSymlinks);
                bVar2 = __gnu_cxx::operator!=(&local_228,&local_248);
                if (!bVar2) break;
                __lhs = __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*(&local_228);
                std::operator+(&local_268,__lhs,"\n");
                std::__cxx11::string::operator+=((string *)&pathIt,(string *)&local_268);
                std::__cxx11::string::~string((string *)&local_268);
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_228);
              }
              std::operator+(&local_2a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_138,"/");
              std::operator+(&local_288,&local_2a8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90);
              std::__cxx11::string::operator+=((string *)&pathIt,(string *)&local_288);
              std::__cxx11::string::~string((string *)&local_288);
              std::__cxx11::string::~string((string *)&local_2a8);
              DVar1 = d;
              Message::Message((Message *)(local_2d8 + 8),cyclicRecursion,(string *)&pathIt);
              std::vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_>::push_back
                        ((vector<cmsys::Glob::Message,_std::allocator<cmsys::Glob::Message>_> *)
                         DVar1.Internal,(value_type *)(local_2d8 + 8));
              Message::~Message((Message *)(local_2d8 + 8));
              std::__cxx11::string::~string((string *)&pathIt);
            }
            bVar2 = false;
          }
LAB_0080b4b2:
          std::__cxx11::string::~string((string *)local_138);
          std::__cxx11::string::~string((string *)(canonicalPath.field_2._M_local_buf + 8));
          if (bVar2) goto LAB_0080b627;
        }
        else {
          if ((this->RecurseListDirs & 1U) != 0) {
            AddFile(this,&this->Internals->Files,(string *)((long)&fname.field_2 + 8));
          }
          bVar2 = RecurseDirectory(this,start + 1,(string *)((long)&fname.field_2 + 8),
                                   (GlobMessages *)d.Internal);
          if (!bVar2) {
            this_local._7_1_ = 0;
            goto LAB_0080b627;
          }
        }
      }
    }
    this_local._7_1_ = 1;
LAB_0080b627:
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string((string *)(fname.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = 1;
  }
  Directory::~Directory(&local_38);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Glob::RecurseDirectory(kwsys_stl::string::size_type start,
  const kwsys_stl::string& dir, GlobMessages* messages)
{
  kwsys::Directory d;
  if ( !d.Load(dir) )
    {
    return true;
    }
  unsigned long cc;
  kwsys_stl::string realname;
  kwsys_stl::string fname;
  for ( cc = 0; cc < d.GetNumberOfFiles(); cc ++ )
    {
    fname = d.GetFile(cc);
    if ( fname == "." || fname == ".." )
      {
      continue;
      }

    if ( start == 0 )
      {
      realname = dir + fname;
      }
    else
      {
      realname = dir + "/" + fname;
      }

#if defined( KWSYS_GLOB_CASE_INDEPENDENT )
    // On Windows and apple, no difference between lower and upper case
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    bool isDir = kwsys::SystemTools::FileIsDirectory(realname);
    bool isSymLink = kwsys::SystemTools::FileIsSymlink(realname);

    if ( isDir && (!isSymLink || this->RecurseThroughSymlinks) )
      {
      if (isSymLink)
        {
        ++this->FollowedSymlinkCount;
        kwsys_stl::string realPathErrorMessage;
        kwsys_stl::string canonicalPath(SystemTools::GetRealPath(dir,
            &realPathErrorMessage));

        if(!realPathErrorMessage.empty())
          {
          if(messages)
            {
            messages->push_back(Message(
                Glob::error, "Canonical path generation from path '"
                + dir + "' failed! Reason: '" + realPathErrorMessage + "'"));
            }
          return false;
          }

        if(kwsys_stl::find(this->VisitedSymlinks.begin(),
            this->VisitedSymlinks.end(),
            canonicalPath) == this->VisitedSymlinks.end())
          {
          if(this->RecurseListDirs)
            {
            // symlinks are treated as directories
            this->AddFile(this->Internals->Files, realname);
            }

          this->VisitedSymlinks.push_back(canonicalPath);
          if(!this->RecurseDirectory(start+1, realname, messages))
            {
            this->VisitedSymlinks.pop_back();

            return false;
            }
          this->VisitedSymlinks.pop_back();
          }
        // else we have already visited this symlink - prevent cyclic recursion
        else if(messages)
          {
          kwsys_stl::string message;
          for(kwsys_stl::vector<kwsys_stl::string>::const_iterator
                pathIt = kwsys_stl::find(this->VisitedSymlinks.begin(),
                                         this->VisitedSymlinks.end(),
                                         canonicalPath);
              pathIt != this->VisitedSymlinks.end(); ++pathIt)
            {
            message += *pathIt + "\n";
            }
          message += canonicalPath + "/" + fname;
          messages->push_back(Message(Glob::cyclicRecursion, message));
          }
        }
      else
        {
        if(this->RecurseListDirs)
          {
          this->AddFile(this->Internals->Files, realname);
          }
        if(!this->RecurseDirectory(start+1, realname, messages))
          {
          return false;
          }
        }
      }
    else
      {
      if ( !this->Internals->Expressions.empty() &&
           this->Internals->Expressions.rbegin()->find(fname) )
        {
        this->AddFile(this->Internals->Files, realname);
        }
      }
    }

  return true;
}